

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void Convert8To16Row_AVX2(uint8_t *src_y,uint16_t *dst_y,int scale,int width)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  undefined1 auVar6 [32];
  
  auVar2 = vpunpcklwd_avx(ZEXT416((uint)scale),ZEXT416((uint)scale));
  auVar6._0_4_ = auVar2._0_4_;
  auVar6._4_4_ = auVar6._0_4_;
  auVar6._8_4_ = auVar6._0_4_;
  auVar6._12_4_ = auVar6._0_4_;
  auVar6._16_4_ = auVar6._0_4_;
  auVar6._20_4_ = auVar6._0_4_;
  auVar6._24_4_ = auVar6._0_4_;
  auVar6._28_4_ = auVar6._0_4_;
  do {
    auVar4 = vpermq_avx2(*(undefined1 (*) [32])src_y,0xd8);
    src_y = (uint8_t *)((long)src_y + 0x20);
    auVar3 = vpunpckhbw_avx2(auVar4,auVar4);
    auVar4 = vpunpcklbw_avx2(auVar4,auVar4);
    auVar4 = vpmulhuw_avx2(auVar4,auVar6);
    auVar3 = vpmulhuw_avx2(auVar3,auVar6);
    *(undefined1 (*) [32])dst_y = auVar4;
    *(undefined1 (*) [32])((long)dst_y + 0x20) = auVar3;
    dst_y = (uint16_t *)((long)dst_y + 0x40);
    iVar5 = width + -0x20;
    bVar1 = 0x1f < width;
    width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void Convert8To16Row_AVX2(const uint8_t* src_y,
                          uint16_t* dst_y,
                          int scale,
                          int width) {
  // clang-format off
  asm volatile (
      "vmovd       %3,%%xmm2                     \n"
      "vpunpcklwd  %%xmm2,%%xmm2,%%xmm2          \n"
      "vbroadcastss %%xmm2,%%ymm2                \n"

    // 32 pixels per loop.
    LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "add         $0x20,%0                      \n"
      "vpunpckhbw  %%ymm0,%%ymm0,%%ymm1          \n"
      "vpunpcklbw  %%ymm0,%%ymm0,%%ymm0          \n"
      "vpmulhuw    %%ymm2,%%ymm0,%%ymm0          \n"
      "vpmulhuw    %%ymm2,%%ymm1,%%ymm1          \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "vmovdqu     %%ymm1,0x20(%1)               \n"
      "add         $0x40,%1                      \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
  : "+r"(src_y),   // %0
    "+r"(dst_y),   // %1
    "+r"(width)    // %2
  : "r"(scale)     // %3
  : "memory", "cc", "xmm0", "xmm1", "xmm2");
  // clang-format on
}